

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseFlattening.cpp
# Opt level: O0

Clause * FMB::ClauseFlattening::resolveNegativeVariableEqualities(Clause *cl)

{
  Term *this;
  bool bVar1;
  uint uVar2;
  Literal **ppLVar3;
  TermList *pTVar4;
  Stack<Kernel::Literal_*> *applicator;
  socklen_t in_ECX;
  Clause *in_RDI;
  uint i;
  RStack<Literal_*> resLits;
  Literal *lit;
  uint idx;
  uint n;
  SingleVar2VarSubst subst;
  NonspecificInference1 *in_stack_ffffffffffffff28;
  Clause *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  NonspecificInference1 local_88 [2];
  Inference *in_stack_ffffffffffffff98;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffffa0;
  uint local_34;
  uint local_18;
  uint local_14;
  SingleVar2VarSubst local_10;
  Clause *local_8;
  
  local_8 = in_RDI;
  local_14 = Kernel::Clause::length(in_RDI);
  local_18 = 0;
  do {
    while (local_14 <= local_18) {
LAB_002a854c:
      if (local_14 <= local_18) {
        return local_8;
      }
      Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)in_stack_ffffffffffffff30);
      for (local_34 = 0; local_34 < local_14; local_34 = local_34 + 1) {
        if (local_34 != local_18) {
          applicator = Lib::
                       Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       ::operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                     *)0x2a85ad);
          bVar1 = resolveNegativeVariableEqualities::SingleVar2VarSubst::isId(&local_10);
          if (bVar1) {
            Kernel::Clause::operator[](local_8,local_34);
          }
          else {
            Kernel::Clause::operator[](local_8,local_34);
            Kernel::SubstHelper::
            apply<FMB::ClauseFlattening::resolveNegativeVariableEqualities(Kernel::Clause*)::SingleVar2VarSubst>
                      ((Literal *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (SingleVar2VarSubst *)applicator);
          }
          Lib::Stack<Kernel::Literal_*>::push
                    ((Stack<Kernel::Literal_*> *)in_stack_ffffffffffffff30,
                     (Literal *)in_stack_ffffffffffffff28);
        }
      }
      Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)0x2a868f);
      Kernel::NonspecificInference1::NonspecificInference1
                (local_88,EQUALITY_RESOLUTION,&local_8->super_Unit);
      Kernel::Inference::Inference((Inference *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28)
      ;
      in_stack_ffffffffffffff30 =
           Kernel::Clause::fromStack(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      local_8 = in_stack_ffffffffffffff30;
      Kernel::Inference::~Inference((Inference *)(local_88 + 1));
      local_14 = local_14 - 1;
      Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    ppLVar3 = Kernel::Clause::operator[](local_8,local_18);
    this = &(*ppLVar3)->super_Term;
    bVar1 = Kernel::Literal::isEquality((Literal *)0x2a8490);
    if ((bVar1) && (bVar1 = Kernel::Literal::isNegative((Literal *)0x2a84a6), bVar1)) {
      Kernel::Term::nthArgument(this,0);
      bVar1 = Kernel::TermList::isVar((TermList *)in_stack_ffffffffffffff30);
      if (bVar1) {
        Kernel::Term::nthArgument(this,1);
        bVar1 = Kernel::TermList::isVar((TermList *)in_stack_ffffffffffffff30);
        if (bVar1) {
          pTVar4 = Kernel::Term::nthArgument(this,0);
          in_stack_ffffffffffffff74 = Kernel::TermList::var(pTVar4);
          pTVar4 = Kernel::Term::nthArgument(this,1);
          uVar2 = Kernel::TermList::var(pTVar4);
          resolveNegativeVariableEqualities::SingleVar2VarSubst::bind
                    (&local_10,in_stack_ffffffffffffff74,(sockaddr *)(ulong)uVar2,in_ECX);
          goto LAB_002a854c;
        }
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

Clause* ClauseFlattening::resolveNegativeVariableEqualities(Clause* cl)
{
  // a helper class to be passed to SubstHelper
  class SingleVar2VarSubst {
    unsigned _from;
    unsigned _to;
  public:
    void bind(unsigned from,unsigned to) {
      _from = from;
      _to = to;
    }
    bool isId() {
      return (_from == _to);
    }
    TermList apply(unsigned var) {
      if (var == _from) {
        return TermList(_to, false);
      } else {
        return TermList(var, false);
      }
    }
  } subst;

  // cout << "Begin: " << cl->toString() << endl;

  unsigned n = cl->length();
  unsigned idx = 0;
  while (true) {
    // scan cl from where we ended last time and look for a new negative two variable equality
    while(idx < n) {
      Literal* lit = (*cl)[idx];
      if (lit->isEquality() && lit->isNegative() && lit->nthArgument(0)->isVar() && lit->nthArgument(1)->isVar()) {
        subst.bind(lit->nthArgument(0)->var(),lit->nthArgument(1)->var());
        break;
      }
      idx++;
    }
    if (idx < n) { // we found one
      // new clause one lit shorter
      RStack<Literal*> resLits;
      for (unsigned i = 0; i < n; i++) {
        if (i != idx) { // skipping literal found at idx
          resLits->push(subst.isId() ? (*cl)[i] : SubstHelper::apply((*cl)[i],subst));
        }
      }
      cl = Clause::fromStack(*resLits, NonspecificInference1(InferenceRule::EQUALITY_RESOLUTION,cl));
      n--;
      // cout << "Update: " << cl->toString() << endl;
    } else {
      // cout << "Done: " << cl->toString() << endl;
      return cl;
    }
  }
}